

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TriangulateProcess.cpp
# Opt level: O1

void __thiscall Assimp::TriangulateProcess::Execute(TriangulateProcess *this,aiScene *pScene)

{
  bool bVar1;
  Logger *pLVar2;
  ulong uVar3;
  bool bVar4;
  bool bVar5;
  
  pLVar2 = DefaultLogger::get();
  Logger::debug(pLVar2,"TriangulateProcess begin");
  if (pScene->mNumMeshes != 0) {
    uVar3 = 0;
    bVar4 = false;
    bVar5 = false;
    do {
      if (pScene->mMeshes[uVar3] != (aiMesh *)0x0) {
        bVar1 = TriangulateMesh((TriangulateProcess *)pLVar2,pScene->mMeshes[uVar3]);
        bVar5 = bVar4;
        if (bVar1) {
          bVar4 = true;
          bVar5 = true;
        }
      }
      uVar3 = uVar3 + 1;
    } while (uVar3 < pScene->mNumMeshes);
    if (bVar5) {
      pLVar2 = DefaultLogger::get();
      Logger::info(pLVar2,"TriangulateProcess finished. All polygons have been triangulated.");
      return;
    }
  }
  pLVar2 = DefaultLogger::get();
  Logger::debug(pLVar2,"TriangulateProcess finished. There was nothing to be done.");
  return;
}

Assistant:

void TriangulateProcess::Execute( aiScene* pScene)
{
    ASSIMP_LOG_DEBUG("TriangulateProcess begin");

    bool bHas = false;
    for( unsigned int a = 0; a < pScene->mNumMeshes; a++)
    {
        if (pScene->mMeshes[ a ]) {
            if ( TriangulateMesh( pScene->mMeshes[ a ] ) ) {
                bHas = true;
            }
        }
    }
    if ( bHas ) {
        ASSIMP_LOG_INFO( "TriangulateProcess finished. All polygons have been triangulated." );
    } else {
        ASSIMP_LOG_DEBUG( "TriangulateProcess finished. There was nothing to be done." );
    }
}